

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_rp_pack_rects(nk_rp_context *context,nk_rp_rect *rects,int num_rects)

{
  nk_rp_node **ppnVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  nk_rp_node *pnVar5;
  nk_rp_coord nVar6;
  nk_rp_coord nVar7;
  nk_rp_coord nVar8;
  nk_rp_coord nVar9;
  int iVar10;
  nk_rp_coord nVar11;
  nk_rp_coord nVar12;
  nk_rp_coord nVar13;
  nk_rp_coord nVar14;
  int iVar15;
  undefined1 auVar16 [16];
  nk_rp_context *pnVar17;
  uint uVar18;
  int iVar19;
  nk_rp_node **ppnVar20;
  ulong uVar21;
  long lVar22;
  int *piVar23;
  ulong uVar24;
  nk_rp_node *pnVar25;
  nk_rp_context *pnVar26;
  nk_rp_node *in_R8;
  nk_rp_node *pnVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  nk_rp_context *pnVar32;
  int iVar33;
  uint uVar34;
  uint uVar35;
  nk_rp_node **ppnVar36;
  nk_rp_rect *pnVar37;
  nk_rp_rect *pnVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int waste;
  uint local_19c;
  uint local_198;
  uint local_194;
  nk_rp_node **local_168;
  uint local_138 [66];
  
  auVar16 = _DAT_0014b090;
  uVar30 = (ulong)(uint)num_rects;
  uVar31 = (ulong)(uint)num_rects;
  if (num_rects < 1) {
    nk_rp_qsort(rects,num_rects,nk_rect_height_compare);
  }
  else {
    lVar22 = uVar31 - 1;
    auVar39._8_4_ = (int)lVar22;
    auVar39._0_8_ = lVar22;
    auVar39._12_4_ = (int)((ulong)lVar22 >> 0x20);
    piVar23 = &rects[1].was_packed;
    uVar24 = 0;
    auVar39 = auVar39 ^ _DAT_0014b090;
    auVar40 = _DAT_0014b0b0;
    do {
      auVar41 = auVar40 ^ auVar16;
      if ((bool)(~(auVar41._4_4_ == auVar39._4_4_ && auVar39._0_4_ < auVar41._0_4_ ||
                  auVar39._4_4_ < auVar41._4_4_) & 1)) {
        piVar23[-4] = (int)uVar24;
      }
      if ((auVar41._12_4_ != auVar39._12_4_ || auVar41._8_4_ <= auVar39._8_4_) &&
          auVar41._12_4_ <= auVar39._12_4_) {
        *piVar23 = (int)uVar24 + 1;
      }
      uVar24 = uVar24 + 2;
      lVar22 = auVar40._8_8_;
      auVar40._0_8_ = auVar40._0_8_ + 2;
      auVar40._8_8_ = lVar22 + 2;
      piVar23 = piVar23 + 8;
    } while ((num_rects + 1U & 0xfffffffe) != uVar24);
    nk_rp_qsort(rects,num_rects,nk_rect_height_compare);
    if (0 < num_rects) {
      ppnVar1 = &context->active_head;
      uVar24 = 0;
      do {
        uVar2 = rects[uVar24].w;
        iVar19 = context->align;
        iVar33 = (uint)uVar2 + iVar19 + -1;
        uVar34 = iVar33 - iVar33 % iVar19;
        if ((int)uVar34 % iVar19 != 0) {
          __assert_fail("width % c->align == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                        ,0x29d3,
                        "struct nk_rp__findresult nk_rp__skyline_find_best_pos(struct nk_rp_context *, int, int)"
                       );
        }
        uVar3 = rects[uVar24].h;
        uVar4 = (ushort)((nk_rp_context *)context->active_head)->width;
        if (context->width < (int)(uVar4 + uVar34)) {
          iVar19 = context->heuristic;
          local_198 = 0x40000000;
          local_19c = 0x40000000;
LAB_0012c9d8:
          local_168 = (nk_rp_node **)0x0;
          local_194 = 0;
        }
        else {
          local_198 = 0x40000000;
          local_168 = (nk_rp_node **)0x0;
          local_19c = 0x40000000;
          pnVar26 = (nk_rp_context *)context->active_head;
          ppnVar36 = ppnVar1;
          do {
            uVar35 = nk_rp__skyline_find_min_y
                               (pnVar26,(nk_rp_node *)(ulong)uVar4,uVar34,(int)local_138,
                                (int *)in_R8);
            iVar19 = context->heuristic;
            if (iVar19 == 0) {
              if ((int)uVar35 < (int)local_19c) {
                local_168 = ppnVar36;
                local_19c = uVar35;
              }
            }
            else if (((int)(uVar3 + uVar35) <= context->height) &&
                    (((int)uVar35 < (int)local_19c ||
                     ((int)local_138[0] < (int)local_198 && uVar35 == local_19c)))) {
              local_198 = local_138[0];
              local_168 = ppnVar36;
              local_19c = uVar35;
            }
            ppnVar36 = (nk_rp_node **)&pnVar26->align;
            uVar4 = (ushort)(*(nk_rp_context **)&pnVar26->align)->width;
            pnVar26 = *(nk_rp_context **)&pnVar26->align;
          } while ((int)(uVar4 + uVar34) <= context->width);
          if (local_168 == (nk_rp_node **)0x0) goto LAB_0012c9d8;
          local_194 = (uint)(*local_168)->x;
        }
        if (iVar19 == 1) {
          pnVar26 = (nk_rp_context *)*ppnVar1;
          pnVar32 = pnVar26;
          ppnVar36 = ppnVar1;
          if ((int)(uint)(ushort)pnVar26->width < (int)uVar34) {
            do {
              pnVar32 = *(nk_rp_context **)&pnVar32->align;
            } while ((ushort)pnVar32->width < uVar34);
          }
          do {
            uVar35 = (ushort)pnVar32->width - uVar34;
            pnVar17 = pnVar26;
            if ((int)uVar35 < 0) {
              __assert_fail("xpos >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                            ,0x2a0d,
                            "struct nk_rp__findresult nk_rp__skyline_find_best_pos(struct nk_rp_context *, int, int)"
                           );
            }
            do {
              pnVar26 = pnVar17;
              ppnVar20 = ppnVar36;
              ppnVar36 = (nk_rp_node **)&pnVar26->align;
              pnVar17 = *(nk_rp_context **)&pnVar26->align;
            } while ((ushort)(*(nk_rp_context **)&pnVar26->align)->width <= uVar35);
            if (uVar35 < (ushort)pnVar26->width) {
              __assert_fail("node->next->x > xpos && node->x <= xpos",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                            ,0x2a13,
                            "struct nk_rp__findresult nk_rp__skyline_find_best_pos(struct nk_rp_context *, int, int)"
                           );
            }
            uVar18 = nk_rp__skyline_find_min_y
                               (pnVar26,(nk_rp_node *)(ulong)uVar35,uVar34,(int)local_138,
                                (int *)in_R8);
            if ((((int)(uVar3 + uVar18) < context->height) && ((int)uVar18 <= (int)local_19c)) &&
               (((uVar18 < local_19c || ((int)local_138[0] < (int)local_198)) ||
                ((local_138[0] == local_198 && ((int)uVar35 < (int)local_194)))))) {
              local_198 = local_138[0];
              local_19c = uVar18;
              local_194 = uVar35;
              local_168 = ppnVar20;
            }
            piVar23 = &pnVar32->align;
            pnVar32 = *(nk_rp_context **)piVar23;
            ppnVar36 = ppnVar20;
          } while (*(nk_rp_context **)piVar23 != (nk_rp_context *)0x0);
        }
        if (((local_168 == (nk_rp_node **)0x0) ||
            (iVar19 = uVar3 + local_19c, context->height < iVar19)) ||
           (pnVar5 = context->free_head, pnVar5 == (nk_rp_node *)0x0)) {
          rects[uVar24].x = 0xffff;
          rects[uVar24].y = 0xffff;
        }
        else {
          pnVar5->x = (nk_rp_coord)local_194;
          pnVar5->y = (nk_rp_coord)iVar19;
          context->free_head = pnVar5->next;
          pnVar27 = *local_168;
          pnVar25 = pnVar27;
          if ((int)(uint)pnVar27->x < (int)local_194) {
            pnVar25 = pnVar27->next;
            local_168 = &pnVar27->next;
          }
          *local_168 = pnVar5;
          in_R8 = pnVar25->next;
          iVar19 = local_194 + uVar2;
          if (in_R8 != (nk_rp_node *)0x0) {
            do {
              pnVar27 = in_R8;
              in_R8 = (nk_rp_node *)(ulong)pnVar27->x;
              if (iVar19 < (int)(uint)pnVar27->x) goto LAB_0012cb8b;
              pnVar25->next = context->free_head;
              context->free_head = pnVar25;
              pnVar25 = pnVar27;
              in_R8 = pnVar27->next;
            } while (pnVar27->next != (nk_rp_node *)0x0);
            in_R8 = (nk_rp_node *)0x0;
          }
LAB_0012cb8b:
          pnVar5->next = pnVar25;
          if ((int)(uint)pnVar25->x < iVar19) {
            pnVar25->x = (nk_rp_coord)iVar19;
          }
          rects[uVar24].x = (nk_rp_coord)local_194;
          rects[uVar24].y = (nk_rp_coord)local_19c;
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 != uVar31);
    }
  }
  uVar34 = ((uint)num_rects >> 1) * 0x10dcd + 1;
  uVar35 = 0;
  uVar24 = 0;
  while( true ) {
    uVar28 = (uint)uVar24;
    uVar18 = (uint)uVar30;
    if (uVar35 + 1 < (uint)uVar30) {
      do {
        uVar21 = uVar30;
        if ((int)uVar24 == 0x40) {
          uVar21 = (ulong)local_138[0];
          uVar24 = 0;
        }
        iVar19 = rects[uVar34 % ((uint)uVar21 - uVar35) + uVar35].was_packed;
        local_138[uVar24] = (uint)uVar21;
        uVar29 = (ulong)(uVar35 - 1);
        while( true ) {
          do {
            uVar28 = (int)uVar29 + 1;
            uVar29 = (ulong)uVar28;
          } while (rects[uVar29].was_packed < iVar19);
          pnVar37 = rects + uVar29;
          do {
            uVar30 = uVar21;
            uVar18 = (uint)uVar30;
            uVar21 = (ulong)(uVar18 - 1);
          } while (iVar19 < rects[uVar21].was_packed);
          if (uVar18 - 1 <= uVar28) break;
          pnVar38 = rects + uVar21;
          iVar10 = pnVar37->id;
          nVar11 = pnVar37->w;
          nVar12 = pnVar37->h;
          nVar13 = pnVar37->x;
          nVar14 = pnVar37->y;
          iVar15 = pnVar37->was_packed;
          nVar6 = pnVar38->w;
          nVar7 = pnVar38->h;
          nVar8 = pnVar38->x;
          nVar9 = pnVar38->y;
          iVar33 = pnVar38->was_packed;
          pnVar37->id = pnVar38->id;
          pnVar37->w = nVar6;
          pnVar37->h = nVar7;
          pnVar37->x = nVar8;
          pnVar37->y = nVar9;
          pnVar37->was_packed = iVar33;
          pnVar38->id = iVar10;
          pnVar38->w = nVar11;
          pnVar38->h = nVar12;
          pnVar38->x = nVar13;
          pnVar38->y = nVar14;
          pnVar38->was_packed = iVar15;
        }
        uVar34 = uVar34 * 0x10dcd + 1;
        uVar28 = (int)uVar24 + 1;
        uVar24 = (ulong)uVar28;
      } while (uVar35 + 1 < uVar18);
    }
    uVar35 = uVar18;
    if (uVar28 == 0) break;
    uVar24 = (ulong)(uVar28 - 1);
    uVar30 = (ulong)local_138[uVar24];
  }
  if (0 < num_rects) {
    lVar22 = 0;
    do {
      uVar34 = 1;
      if (*(short *)((long)&rects->x + lVar22) == -1) {
        uVar34 = (uint)(*(short *)((long)&rects->y + lVar22) != -1);
      }
      *(uint *)((long)&rects->was_packed + lVar22) = uVar34;
      lVar22 = lVar22 + 0x10;
    } while (uVar31 * 0x10 != lVar22);
  }
  return;
}

Assistant:

NK_INTERN void
nk_rp_pack_rects(struct nk_rp_context *context, struct nk_rp_rect *rects, int num_rects)
{
    int i;
    /* we use the 'was_packed' field internally to allow sorting/unsorting */
    for (i=0; i < num_rects; ++i) {
        rects[i].was_packed = i;
    }

    /* sort according to heuristic */
    nk_rp_qsort(rects, (unsigned)num_rects, nk_rect_height_compare);

    for (i=0; i < num_rects; ++i) {
        struct nk_rp__findresult fr = nk_rp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
        if (fr.prev_link) {
            rects[i].x = (nk_rp_coord) fr.x;
            rects[i].y = (nk_rp_coord) fr.y;
        } else {
            rects[i].x = rects[i].y = NK_RP__MAXVAL;
        }
    }

    /* unsort */
    nk_rp_qsort(rects, (unsigned)num_rects, nk_rect_original_order);

    /* set was_packed flags */
    for (i=0; i < num_rects; ++i)
        rects[i].was_packed = !(rects[i].x == NK_RP__MAXVAL && rects[i].y == NK_RP__MAXVAL);
}